

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O2

void __thiscall
bandit::reporter::info::info
          (info *this,ostream *stm,failure_formatter_t *formatter,colorizer_t *colorizer)

{
  colored_base::colored_base(&this->super_colored_base,stm,formatter,colorizer);
  (this->super_colored_base).super_progress_base.super_interface._vptr_interface =
       (_func_int **)&PTR__info_0011b618;
  this->indentation_ = 0;
  this->not_yet_shown_ = 0;
  std::
  stack<bandit::reporter::info::context_info,std::deque<bandit::reporter::info::context_info,std::allocator<bandit::reporter::info::context_info>>>
  ::
  stack<std::deque<bandit::reporter::info::context_info,std::allocator<bandit::reporter::info::context_info>>,void>
            (&this->context_stack_);
  return;
}

Assistant:

info(std::ostream& stm, const detail::failure_formatter_t& formatter, const detail::colorizer_t& colorizer)
          : colored_base(stm, formatter, colorizer),
            indentation_(0), not_yet_shown_(0), context_stack_() {}